

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outdata_reply.c
# Opt level: O3

int mpt_outdata_reply(mpt_outdata *out,size_t len,void *hdr,mpt_message *src)

{
  size_t *psVar1;
  byte bVar2;
  uint __addr_len;
  int iVar3;
  sockaddr *psVar4;
  long lVar5;
  undefined1 *__dest;
  ssize_t sVar6;
  byte bVar7;
  int __fd;
  char *pcVar8;
  ulong __n;
  mpt_message msg;
  uint8_t tmp [256];
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [264];
  
  __fd = (out->sock)._id;
  if (__fd < 0) {
    iVar3 = -1;
  }
  else {
    bVar7 = out->_idlen;
    __n = (ulong)bVar7;
    bVar2 = out->_smax;
    iVar3 = -2;
    if (__n <= len && len <= __n + bVar2) {
      if (__n != 0) {
        memcpy(local_138,hdr,__n);
        hdr = (void *)((long)hdr + __n);
      }
      psVar4 = (sockaddr *)0x0;
      if (bVar2 == 0) {
        hdr = psVar4;
      }
      bVar7 = (char)len - bVar7;
      if (bVar7 == 0) {
        hdr = psVar4;
      }
      __addr_len = (uint)bVar7;
      if (bVar2 == 0) {
        __addr_len = 0;
      }
      if (src == (mpt_message *)0x0) {
        __dest = local_138;
      }
      else {
        local_158 = (undefined4)src->used;
        uStack_154 = *(undefined4 *)((long)&src->used + 4);
        uStack_150 = *(undefined4 *)&src->base;
        uStack_14c = *(undefined4 *)((long)&src->base + 4);
        local_148 = *(undefined4 *)&src->cont;
        uStack_144 = *(undefined4 *)((long)&src->cont + 4);
        uStack_140 = (undefined4)src->clen;
        uStack_13c = *(undefined4 *)((long)&src->clen + 4);
        psVar4 = (sockaddr *)mpt_message_read(&local_158,0x100 - __n,local_138 + __n);
        lVar5 = mpt_message_length(&local_158);
        if (lVar5 == 0) {
          __dest = local_138;
        }
        else {
          pcVar8 = psVar4->sa_data + lVar5 + __n + -2;
          __dest = (undefined1 *)mpt_array_append(out,pcVar8,0);
          if (__dest == (undefined1 *)0x0) {
            return -0x11;
          }
          psVar1 = &((out->buf)._buf)->_used;
          *psVar1 = *psVar1 - (long)pcVar8;
          if (__n != 0) {
            memcpy(__dest,hdr,__n);
          }
          psVar4 = (sockaddr *)mpt_message_read(&local_158,(long)pcVar8 - __n,__dest + __n);
        }
        __fd = (out->sock)._id;
      }
      sVar6 = sendto(__fd,__dest,(size_t)(psVar4->sa_data + (__n - 2)),0,(sockaddr *)hdr,__addr_len)
      ;
      iVar3 = -4;
      if (-1 < (int)sVar6) {
        iVar3 = (int)sVar6;
      }
    }
  }
  return iVar3;
}

Assistant:

extern int mpt_outdata_reply(MPT_STRUCT(outdata) *out, size_t len, const void *hdr, const MPT_STRUCT(message) *src)
{
	uint8_t tmp[0x100]; /* 256b reply limit */
	uint8_t *ptr = tmp;
	int ret;
	uint8_t ilen, slen;
	uint16_t max;
	
	/* already answered */
	if (!MPT_socket_active(&out->sock)) {
		return MPT_ERROR(BadArgument);
	}
	ilen = out->_idlen;
	slen = out->_smax;
	max = ilen + slen;
	
	if (len > max || len < ilen) {
		return MPT_ERROR(BadValue);
	}
	if (ilen) {
		memcpy(tmp, hdr, ilen);
		hdr = ((uint8_t *) hdr) + ilen;
	}
	if (!slen || !(slen = len - ilen)) {
		hdr = 0;
	}
	len = 0;
	if (src) {
		MPT_STRUCT(message) msg = *src;
		size_t left;
		len = mpt_message_read(&msg, sizeof(tmp) - ilen, tmp + ilen);
		/* temporary reply limit exceeded */
		if ((left = mpt_message_length(&msg))) {
			len += ilen + left;
			/* use temporary data in unused buffer segment */
			if (!(ptr = mpt_array_append(&out->buf, len, 0))) {
				return MPT_ERROR(MissingBuffer);
			}
			out->buf._buf->_used -= len;
			if (ilen) {
				memcpy(ptr, hdr, ilen);
			}
			len = mpt_message_read(&msg, len - ilen, ptr + ilen);
		}
	}
	ret = sendto(out->sock._id, ptr, ilen + len, 0, hdr, slen);
	
	if (ret < 0) {
		return MPT_ERROR(BadOperation);
	}
	return ret;
}